

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O0

bool __thiscall
cmMacroFunctionBlocker::IsFunctionBlocked
          (cmMacroFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *param_3)

{
  cmExecutionStatus *this_00;
  int iVar1;
  char *pcVar2;
  cmMacroHelperCommand *this_01;
  cmListFileContext *pcVar3;
  cmState *this_02;
  reference name;
  undefined1 local_78 [16];
  cmMacroHelperCommand *f;
  string local_50;
  cmExecutionStatus *local_30;
  cmExecutionStatus *param_3_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmMacroFunctionBlocker *this_local;
  
  local_30 = param_3;
  param_3_local = (cmExecutionStatus *)mf;
  mf_local = (cmMakefile *)lff;
  lff_local = (cmListFileFunction *)this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"macro");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"endmacro");
    this_00 = param_3_local;
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_50,"MACROS",(allocator *)&stack0xffffffffffffffaf);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this->Args,0);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AppendProperty((cmMakefile *)this_00,&local_50,pcVar2,false);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
        this_01 = (cmMacroHelperCommand *)operator_new(0xa0);
        cmMacroHelperCommand::cmMacroHelperCommand(this_01);
        local_78._8_8_ = this_01;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_01->Args,&this->Args);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
                  ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                   (local_78._8_8_ + 0x48),&this->Functions);
        pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
        std::__cxx11::string::operator=
                  ((string *)(local_78._8_8_ + 0x80),(string *)&pcVar3->FilePath);
        cmMakefile::RecordPolicies((cmMakefile *)param_3_local,(PolicyMap *)(local_78._8_8_ + 0x60))
        ;
        this_02 = cmMakefile::GetState((cmMakefile *)param_3_local);
        name = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->Args,0);
        cmState::AddScriptedCommand(this_02,name,(cmCommand *)local_78._8_8_);
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_78,(cmFunctionBlocker *)param_3_local,
                   (cmListFileFunction *)this);
        ::cm::auto_ptr<cmFunctionBlocker>::~auto_ptr((auto_ptr<cmFunctionBlocker> *)local_78);
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,(value_type *)mf_local);
  return true;
}

Assistant:

bool cmMacroFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                               cmMakefile& mf,
                                               cmExecutionStatus&)
{
  // record commands until we hit the ENDMACRO
  // at the ENDMACRO call we shift gears and start looking for invocations
  if (!cmSystemTools::Strucmp(lff.Name.c_str(), "macro")) {
    this->Depth++;
  } else if (!cmSystemTools::Strucmp(lff.Name.c_str(), "endmacro")) {
    // if this is the endmacro for this macro then execute
    if (!this->Depth) {
      mf.AppendProperty("MACROS", this->Args[0].c_str());
      // create a new command and add it to cmake
      cmMacroHelperCommand* f = new cmMacroHelperCommand();
      f->Args = this->Args;
      f->Functions = this->Functions;
      f->FilePath = this->GetStartingContext().FilePath;
      mf.RecordPolicies(f->Policies);
      mf.GetState()->AddScriptedCommand(this->Args[0], f);
      // remove the function blocker now that the macro is defined
      mf.RemoveFunctionBlocker(this, lff);
      return true;
    }
    // decrement for each nested macro that ends
    this->Depth--;
  }

  // if it wasn't an endmacro and we are not executing then we must be
  // recording
  this->Functions.push_back(lff);
  return true;
}